

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_writer_add_to_central_dir
                  (mz_zip_archive *pZip,char *pFilename,mz_uint16 filename_size,void *pExtra,
                  mz_uint16 extra_size,void *pComment,mz_uint16 comment_size,mz_uint64 uncomp_size,
                  mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,
                  mz_uint16 dos_time,mz_uint16 dos_date,mz_uint64 param_15,mz_uint32 ext_attributes,
                  char *user_extra_data,mz_uint user_extra_data_len)

{
  mz_zip_internal_state *pArray;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  mz_bool mVar4;
  ulong uVar5;
  undefined6 in_register_00000012;
  ulong uVar6;
  mz_uint64 mVar7;
  undefined1 uVar8;
  undefined2 in_register_00000082;
  undefined4 in_register_00000084;
  size_t orig_size;
  mz_uint32 central_dir_ofs;
  undefined8 local_a8;
  mz_uint16 mStack_a0;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  mz_uint32 local_98;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  mz_uint16 local_88;
  undefined4 uStack_86;
  mz_uint32 local_82;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined4 local_70;
  undefined4 local_6c;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  void *local_40;
  undefined8 local_38;
  
  pArray = pZip->m_pState;
  uVar6 = (pArray->m_central_dir).m_size;
  local_6c = (undefined4)uVar6;
  if ((param_15 >> 0x20 != 0) && (pArray->m_zip64 == 0)) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    pZip->m_last_error = MZ_ZIP_FILE_TOO_LARGE;
    return 0;
  }
  local_50 = (ulong)filename_size;
  local_58 = (ulong)extra_size;
  local_60 = (ulong)user_extra_data_len;
  uVar5 = CONCAT62(in_register_00000012,filename_size) & 0xffffffff;
  local_68 = (ulong)comment_size;
  if (0xfffffffe < local_58 + local_50 + local_68 + local_60 + uVar6 + 0x2e) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  uVar8 = 0x14;
  if (method == 0) {
    uVar8 = 0;
  }
  uStack_86 = 0;
  local_a8 = (ulong)CONCAT16(uVar8,0x31e02014b50);
  _mStack_a0 = CONCAT17((char)(dos_date >> 8),
                        CONCAT16((char)dos_date,
                                 CONCAT15((char)(dos_time >> 8),
                                          CONCAT14((char)dos_time,
                                                   CONCAT13((char)(method >> 8),
                                                            CONCAT12((char)method,bit_flags))))));
  if (0xfffffffe < comp_size) {
    comp_size = 0xffffffff;
  }
  if (0xfffffffe < uncomp_size) {
    uncomp_size = 0xffffffff;
  }
  _local_98 = CONCAT17((char)(comp_size >> 0x18),
                       CONCAT16((char)(comp_size >> 0x10),
                                CONCAT15((char)(comp_size >> 8),
                                         CONCAT14((char)comp_size,uncomp_crc32))));
  uStack_90 = (undefined1)uncomp_size;
  uStack_8f = (undefined1)(uncomp_size >> 8);
  uStack_8e = (undefined1)(uncomp_size >> 0x10);
  uStack_8d = (undefined1)(uncomp_size >> 0x18);
  local_38 = CONCAT44(in_register_00000084,CONCAT22(in_register_00000082,extra_size));
  iVar3 = user_extra_data_len + CONCAT22(in_register_00000082,extra_size);
  local_70 = (undefined4)CONCAT62(in_register_00000012,filename_size);
  uStack_8c = (undefined1)uVar5;
  uStack_8b = (undefined1)(uVar5 >> 8);
  uStack_8a = (undefined1)iVar3;
  uStack_89 = (undefined1)((uint)iVar3 >> 8);
  mVar7 = 0xffffffff;
  if (param_15 < 0xffffffff) {
    mVar7 = param_15;
  }
  _local_82 = CONCAT17((char)(mVar7 >> 0x18),
                       CONCAT16((char)(mVar7 >> 0x10),
                                CONCAT15((char)(mVar7 >> 8),CONCAT14((char)mVar7,ext_attributes))));
  uVar5 = uVar6 + 0x2e;
  local_48 = pComment;
  local_40 = pExtra;
  local_88 = comment_size;
  if ((pArray->m_central_dir).m_capacity < uVar5) {
    mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar5,1);
    if (mVar4 != 0) goto LAB_0010c482;
  }
  else {
LAB_0010c482:
    (pArray->m_central_dir).m_size = uVar5;
    uVar5 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(uVar6 * uVar5 + (long)(pArray->m_central_dir).m_p),&local_a8,uVar5 * 0x2e);
    sVar1 = (pArray->m_central_dir).m_size;
    uVar5 = local_50 + sVar1;
    if ((pArray->m_central_dir).m_capacity < uVar5) {
      mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar5,1);
      if (mVar4 != 0) goto LAB_0010c4d1;
      bVar2 = true;
    }
    else {
LAB_0010c4d1:
      (pArray->m_central_dir).m_size = uVar5;
      bVar2 = false;
    }
    if ((short)local_70 != 0 && !bVar2) {
      uVar5 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar1 * uVar5 + (long)(pArray->m_central_dir).m_p),pFilename,local_50 * uVar5)
      ;
    }
    if (!bVar2) {
      sVar1 = (pArray->m_central_dir).m_size;
      uVar5 = sVar1 + local_58;
      if ((pArray->m_central_dir).m_capacity < uVar5) {
        mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar5,1);
        if (mVar4 != 0) goto LAB_0010c541;
        bVar2 = true;
      }
      else {
LAB_0010c541:
        (pArray->m_central_dir).m_size = uVar5;
        bVar2 = false;
      }
      if ((short)local_38 != 0 && !bVar2) {
        uVar5 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(sVar1 * uVar5 + (long)(pArray->m_central_dir).m_p),local_40,local_58 * uVar5
              );
      }
      if (!bVar2) {
        sVar1 = (pArray->m_central_dir).m_size;
        uVar5 = sVar1 + local_60;
        if ((pArray->m_central_dir).m_capacity < uVar5) {
          mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar5,1);
          if (mVar4 != 0) goto LAB_0010c5ad;
          bVar2 = true;
        }
        else {
LAB_0010c5ad:
          (pArray->m_central_dir).m_size = uVar5;
          bVar2 = false;
        }
        if (user_extra_data_len != 0 && !bVar2) {
          uVar5 = (ulong)(pArray->m_central_dir).m_element_size;
          memcpy((void *)(sVar1 * uVar5 + (long)(pArray->m_central_dir).m_p),user_extra_data,
                 local_60 * uVar5);
        }
        if (!bVar2) {
          sVar1 = (pArray->m_central_dir).m_size;
          uVar5 = sVar1 + local_68;
          if ((pArray->m_central_dir).m_capacity < uVar5) {
            mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar5,1);
            if (mVar4 != 0) goto LAB_0010c61b;
            bVar2 = true;
          }
          else {
LAB_0010c61b:
            (pArray->m_central_dir).m_size = uVar5;
            bVar2 = false;
          }
          if (comment_size != 0 && !bVar2) {
            uVar5 = (ulong)(pArray->m_central_dir).m_element_size;
            memcpy((void *)(sVar1 * uVar5 + (long)(pArray->m_central_dir).m_p),local_48,
                   local_68 * uVar5);
          }
          if (!bVar2) {
            sVar1 = (pArray->m_central_dir_offsets).m_size;
            uVar5 = sVar1 + 1;
            if (uVar5 <= (pArray->m_central_dir_offsets).m_capacity) {
LAB_0010c6c8:
              (pArray->m_central_dir_offsets).m_size = uVar5;
              uVar6 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
              memcpy((void *)(sVar1 * uVar6 + (long)(pArray->m_central_dir_offsets).m_p),&local_6c,
                     uVar6);
              return 1;
            }
            mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar5,1);
            if (mVar4 != 0) goto LAB_0010c6c8;
          }
        }
      }
    }
  }
  if ((pArray->m_central_dir).m_capacity < uVar6) {
    mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar6,0);
    if (mVar4 == 0) goto LAB_0010c673;
  }
  (pArray->m_central_dir).m_size = uVar6;
LAB_0010c673:
  if (pZip != (mz_zip_archive *)0x0) {
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_add_to_central_dir(
    mz_zip_archive *pZip, const char *pFilename, mz_uint16 filename_size,
    const void *pExtra, mz_uint16 extra_size, const void *pComment,
    mz_uint16 comment_size, mz_uint64 uncomp_size, mz_uint64 comp_size,
    mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags,
    mz_uint16 dos_time, mz_uint16 dos_date, mz_uint64 local_header_ofs,
    mz_uint32 ext_attributes, const char *user_extra_data,
    mz_uint user_extra_data_len) {
  mz_zip_internal_state *pState = pZip->m_pState;
  mz_uint32 central_dir_ofs = (mz_uint32)pState->m_central_dir.m_size;
  size_t orig_central_dir_size = pState->m_central_dir.m_size;
  mz_uint8 central_dir_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];

  if (!pZip->m_pState->m_zip64) {
    if (local_header_ofs > 0xFFFFFFFF)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_TOO_LARGE);
  }

  /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
  if (((mz_uint64)pState->m_central_dir.m_size +
       MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + extra_size +
       user_extra_data_len + comment_size) >= MZ_UINT32_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

  if (!mz_zip_writer_create_central_dir_header(
          pZip, central_dir_header, filename_size,
          (mz_uint16)(extra_size + user_extra_data_len), comment_size,
          uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time,
          dos_date, local_header_ofs, ext_attributes))
    return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

  if ((!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_dir_header,
                               MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pFilename,
                               filename_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pExtra,
                               extra_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, user_extra_data,
                               user_extra_data_len)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pComment,
                               comment_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets,
                               &central_dir_ofs, 1))) {
    /* Try to resize the central directory array back into its original state.
     */
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
  }

  return MZ_TRUE;
}